

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_broker.cpp
# Opt level: O0

int run_broker(switches *opt)

{
  pointer *cb;
  uint num_read_threads;
  bool bVar1;
  __int_type _Var2;
  element_type *peVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  element_type *record_file_00;
  element_type *peVar5;
  element_type *peVar6;
  shared_ptr<pstore::broker::scavenger> *scav_00;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  czstring local_340;
  not_null<const_char_*> local_330;
  not_null<const_char_*> local_328;
  __basic_future<void> *local_320;
  future<void> *f;
  iterator __end1;
  iterator __begin1;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> *__range1;
  anon_class_40_4_dc0f0d18_for__M_fn local_2f8;
  value_type local_2d0;
  uint local_2bc;
  uint ctr;
  not_null<pstore::maybe<pstore::http::server_status,_void>_*> local_2b0;
  int local_2a4;
  undefined1 local_2a0 [8];
  message_ptr msg;
  undefined1 local_278 [8];
  player playback_file;
  not_null<std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_*> local_218;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> local_210;
  not_null<std::atomic<bool>_*> local_1f8;
  not_null<pstore::maybe<pstore::http::server_status,_void>_*> local_1f0;
  weak_ptr<pstore::broker::scavenger> local_1e8;
  weak_ptr<pstore::broker::command_processor> local_1d8;
  thread local_1c8;
  undefined1 local_1c0 [8];
  shared_ptr<pstore::broker::scavenger> scav;
  atomic<bool> *local_1a8;
  undefined1 local_1a0 [8];
  shared_ptr<pstore::broker::command_processor> commands;
  undefined1 local_181;
  undefined1 local_180 [7];
  atomic<bool> uptime_done;
  maybe<pstore::http::server_status,_void> http_status;
  thread quit;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> futures;
  undefined1 local_100 [8];
  fifo_path fifo;
  undefined1 local_78 [24];
  shared_ptr<pstore::broker::recorder> record_file;
  allocator local_39;
  string local_38;
  not_null<const_char_*> local_18;
  switches *local_10;
  switches *opt_local;
  
  local_10 = opt;
  pstore::gsl::not_null<const_char_*>::not_null(&local_18,"main");
  pstore::threads::set_name(local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"broker.main",&local_39);
  pstore::create_log_stream(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pstore::gsl::not_null<const_char_*>::not_null
            ((not_null<const_char_*> *)
             &record_file.super___shared_ptr<pstore::broker::recorder,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,"broker starting");
  pstore::log((pstore *)0x5,__x);
  std::shared_ptr<pstore::broker::recorder>::shared_ptr
            ((shared_ptr<pstore::broker::recorder> *)(local_78 + 0x10));
  bVar1 = pstore::
          maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          ::has_value(&local_10->record_path);
  if (bVar1) {
    pstore::
    maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
    operator*(&local_10->record_path);
    std::make_shared<pstore::broker::recorder,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    std::shared_ptr<pstore::broker::recorder>::operator=
              ((shared_ptr<pstore::broker::recorder> *)(local_78 + 0x10),
               (shared_ptr<pstore::broker::recorder> *)local_78);
    std::shared_ptr<pstore::broker::recorder>::~shared_ptr
              ((shared_ptr<pstore::broker::recorder> *)local_78);
  }
  pstore::gsl::not_null<const_char_*>::not_null
            ((not_null<const_char_*> *)&fifo.update_cb_._M_invoker,"opening pipe");
  pstore::log((pstore *)0x5,__x_00);
  bVar1 = pstore::
          maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          ::has_value(&local_10->pipe_path);
  if (bVar1) {
    pstore::
    maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
    operator->(&local_10->pipe_path);
    local_340 = (czstring)std::__cxx11::string::c_str();
  }
  else {
    local_340 = (czstring)0x0;
  }
  cb = &futures.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  std::function<void(pstore::brokerface::fifo_path::operation)>::
  function<void(&)(pstore::brokerface::fifo_path::operation),void>
            ((function<void(pstore::brokerface::fifo_path::operation)> *)cb,
             pstore::brokerface::fifo_path::default_update_cb);
  pstore::brokerface::fifo_path::fifo_path((fifo_path *)local_100,local_340,(update_callback *)cb);
  std::function<void_(pstore::brokerface::fifo_path::operation)>::~function
            ((function<void_(pstore::brokerface::fifo_path::operation)> *)
             &futures.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::vector
            ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&quit);
  std::thread::thread((thread *)((long)&http_status.storage_ + 0x30));
  anon_unknown.dwarf_1e9ac::get_http_server_status
            ((maybe<pstore::http::server_status,_void> *)local_180,&local_10->http_port);
  local_181 = (__atomic_base<bool>)false;
  pstore::gsl::not_null<const_char_*>::not_null
            ((not_null<const_char_*> *)
             &commands.
              super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,"starting threads");
  pstore::log((pstore *)0x5,__x_01);
  local_1a8 = (atomic<bool> *)local_180;
  scav.super___shared_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_181;
  std::
  make_shared<pstore::broker::command_processor,unsigned_int_const&,pstore::maybe<pstore::http::server_status,void>*,std::atomic<bool>*,std::chrono::duration<long,std::ratio<1l,1l>>const&>
            ((uint *)local_1a0,
             (maybe<pstore::http::server_status,_void> **)&local_10->num_read_threads,&local_1a8,
             (duration<long,_std::ratio<1L,_1L>_> *)
             &scav.super___shared_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::make_shared<pstore::broker::scavenger,std::shared_ptr<pstore::broker::command_processor>&>
            ((shared_ptr<pstore::broker::command_processor> *)local_1c0);
  peVar3 = std::
           __shared_ptr_access<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_1a0);
  pstore::broker::command_processor::attach_scavenger
            (peVar3,(shared_ptr<pstore::broker::scavenger> *)local_1c0);
  anon_unknown.dwarf_1e9ac::make_weak<pstore::broker::command_processor>
            ((anon_unknown_dwarf_1e9ac *)&local_1d8,
             (shared_ptr<pstore::broker::command_processor> *)local_1a0);
  anon_unknown.dwarf_1e9ac::make_weak<pstore::broker::scavenger>
            ((anon_unknown_dwarf_1e9ac *)&local_1e8,
             (shared_ptr<pstore::broker::scavenger> *)local_1c0);
  num_read_threads = local_10->num_read_threads;
  pstore::gsl::not_null<pstore::maybe<pstore::http::server_status,_void>_*>::not_null
            (&local_1f0,(maybe<pstore::http::server_status,_void> *)local_180);
  pstore::gsl::not_null<std::atomic<bool>_*>::not_null(&local_1f8,(atomic<bool> *)&local_181);
  pstore::broker::create_quit_thread
            ((broker *)&local_1c8,&local_1d8,&local_1e8,num_read_threads,local_1f0,local_1f8);
  std::thread::operator=((thread *)((long)&http_status.storage_ + 0x30),&local_1c8);
  std::thread::~thread(&local_1c8);
  std::weak_ptr<pstore::broker::scavenger>::~weak_ptr(&local_1e8);
  std::weak_ptr<pstore::broker::command_processor>::~weak_ptr(&local_1d8);
  scav_00 = (shared_ptr<pstore::broker::scavenger> *)local_1c0;
  anon_unknown.dwarf_1e9ac::create_worker_threads
            (&local_210,(shared_ptr<pstore::broker::command_processor> *)local_1a0,
             (fifo_path *)local_100,scav_00,(atomic<bool> *)&local_181);
  std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::operator=
            ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&quit,&local_210);
  std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector(&local_210);
  pstore::gsl::not_null<std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_*>::
  not_null(&local_218,(vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&quit);
  pstore::gsl::not_null<pstore::maybe<pstore::http::server_status,_void>_*>::not_null
            ((not_null<pstore::maybe<pstore::http::server_status,_void>_*> *)
             &playback_file.file_.file_,(maybe<pstore::http::server_status,_void> *)local_180);
  anon_unknown.dwarf_1e9ac::create_http_worker_thread
            (local_218,
             (not_null<pstore::maybe<pstore::http::server_status,_void>_*>)
             playback_file.file_._40_8_,(bool)(local_10->announce_http_port & 1));
  bVar1 = pstore::
          maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          ::has_value(&local_10->playback_path);
  if (bVar1) {
    pbVar4 = pstore::
             maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::operator*(&local_10->playback_path);
    std::__cxx11::string::string((string *)&msg,(string *)pbVar4);
    pstore::broker::player::player((player *)local_278,(string *)&msg);
    std::__cxx11::string::~string((string *)&msg);
    __buf = extraout_RDX;
    do {
      pstore::broker::player::read((player *)local_2a0,(int)local_278,__buf,(size_t)scav_00);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_2a0);
      if (bVar1) {
        peVar3 = std::
                 __shared_ptr_access<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_1a0);
        record_file_00 =
             std::__shared_ptr<pstore::broker::recorder,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<pstore::broker::recorder,_(__gnu_cxx::_Lock_policy)2> *)
                        (local_78 + 0x10));
        pstore::broker::command_processor::push_command
                  (peVar3,(message_ptr *)local_2a0,record_file_00);
        local_2a4 = 0;
      }
      else {
        local_2a4 = 3;
      }
      std::
      unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
      ::~unique_ptr((unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
                     *)local_2a0);
      __buf = extraout_RDX_00;
    } while (local_2a4 == 0);
    peVar5 = std::__shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>
                         *)local_1a0);
    peVar6 = std::__shared_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2> *)
                        local_1c0);
    pstore::gsl::not_null<pstore::maybe<pstore::http::server_status,_void>_*>::not_null
              (&local_2b0,(maybe<pstore::http::server_status,_void> *)local_180);
    pstore::gsl::not_null<std::atomic<bool>_*>::not_null
              ((not_null<std::atomic<bool>_*> *)&stack0xfffffffffffffd48,(atomic<bool> *)&local_181)
    ;
    pstore::broker::shutdown((int)peVar5,(int)peVar6);
    pstore::broker::player::~player((player *)local_278);
  }
  else {
    for (local_2bc = 0; local_2bc < local_10->num_read_threads; local_2bc = local_2bc + 1) {
      local_2f8.ctr = local_2bc;
      local_2f8.fifo = (fifo_path *)local_100;
      local_2f8.record_file = (shared_ptr<pstore::broker::recorder> *)(local_78 + 0x10);
      std::shared_ptr<pstore::broker::command_processor>::shared_ptr
                (&local_2f8.commands,(shared_ptr<pstore::broker::command_processor> *)local_1a0);
      (anonymous_namespace)::create_thread<run_broker(switches_const&)::__0>
                ((_anonymous_namespace_ *)&local_2d0,&local_2f8);
      std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::push_back
                ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&quit,&local_2d0)
      ;
      std::future<void>::~future(&local_2d0);
      run_broker(switches_const&)::$_0::~__0((__0 *)&local_2f8);
    }
  }
  std::shared_ptr<pstore::broker::scavenger>::~shared_ptr
            ((shared_ptr<pstore::broker::scavenger> *)local_1c0);
  std::shared_ptr<pstore::broker::command_processor>::~shared_ptr
            ((shared_ptr<pstore::broker::command_processor> *)local_1a0);
  pstore::gsl::not_null<const_char_*>::not_null((not_null<const_char_*> *)&__range1,"waiting");
  pstore::log((pstore *)0x5,__x_02);
  __end1 = std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::begin
                     ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&quit);
  f = (future<void> *)
      std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::end
                ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&quit);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
                                *)&f);
    if (!bVar1) {
      pstore::gsl::not_null<const_char_*>::not_null
                (&local_328,"worker threads done: stopping quit thread");
      pstore::log((pstore *)0x5,__x_03);
      pstore::broker::notify_quit_thread();
      std::thread::join();
      pstore::gsl::not_null<const_char_*>::not_null(&local_330,"exiting");
      pstore::log((pstore *)0x5,__x_04);
      _Var2 = std::__atomic_base::operator_cast_to_int((__atomic_base *)&pstore::broker::exit_code);
      local_2a4 = 1;
      pstore::maybe<pstore::http::server_status,_void>::~maybe
                ((maybe<pstore::http::server_status,_void> *)local_180);
      std::thread::~thread((thread *)((long)&http_status.storage_ + 0x30));
      std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector
                ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&quit);
      pstore::brokerface::fifo_path::~fifo_path((fifo_path *)local_100);
      std::shared_ptr<pstore::broker::recorder>::~shared_ptr
                ((shared_ptr<pstore::broker::recorder> *)(local_78 + 0x10));
      return _Var2;
    }
    local_320 = &__gnu_cxx::
                 __normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
                 ::operator*(&__end1)->super___basic_future<void>;
    bVar1 = std::__basic_future<void>::valid(local_320);
    if (!bVar1) break;
    std::future<void>::get((future<void> *)local_320);
    __gnu_cxx::
    __normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
    ::operator++(&__end1);
  }
  pstore::assert_failed
            ("f.valid ()",
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/brokerd/run_broker.cpp"
             ,0xe8);
}

Assistant:

int run_broker (switches const & opt) {
    using priority = logger::priority;

    threads::set_name ("main");
    create_log_stream ("broker.main");
    log (priority::notice, "broker starting");

#ifdef _WIN32
    wsa_startup startup;
    if (!startup.started ()) {
        throw std::runtime_error ("WSAStartup() failed, broker exited");
    }
#endif // _WIN32

    // If we're recording the messages we receive, then create the file in which they
    // will be stored.
    std::shared_ptr<broker::recorder> record_file;
    if (opt.record_path.has_value ()) {
        record_file = std::make_shared<broker::recorder> (*opt.record_path);
    }

    // TODO: ensure that this is a singleton process?
    log (priority::notice, "opening pipe");

    brokerface::fifo_path fifo{opt.pipe_path.has_value () ? opt.pipe_path->c_str () : nullptr};

    std::vector<std::future<void>> futures;
    std::thread quit;

    maybe<http::server_status> http_status = get_http_server_status (opt.http_port);
    std::atomic<bool> uptime_done{false};

    log (priority::notice, "starting threads");
    {
        auto commands = std::make_shared<broker::command_processor> (
            opt.num_read_threads, &http_status, &uptime_done, opt.scavenge_time);
        auto scav = std::make_shared<broker::scavenger> (commands);
        commands->attach_scavenger (scav);

        quit = create_quit_thread (make_weak (commands), make_weak (scav), opt.num_read_threads,
                                   &http_status, &uptime_done);

        futures = create_worker_threads (commands, fifo, scav, &uptime_done);
        create_http_worker_thread (&futures, &http_status, opt.announce_http_port);

        if (opt.playback_path.has_value ()) {
            broker::player playback_file (*opt.playback_path);
            while (auto msg = playback_file.read ()) {
                commands->push_command (std::move (msg), record_file.get ());
            }
            shutdown (commands.get (), scav.get (), -1 /*signum*/, 0U /*num read threads*/,
                      &http_status, &uptime_done);
        } else {
            for (auto ctr = 0U; ctr < opt.num_read_threads; ++ctr) {
                futures.push_back (create_thread ([ctr, &fifo, &record_file, commands] () {
                    auto const name = "read"s + std::to_string (ctr);
                    threads::set_name (name.c_str ());
                    create_log_stream ("broker." + name);
                    read_loop (fifo, record_file, commands);
                }));
            }
        }
    }

    log (priority::notice, "waiting");
    for (auto & f : futures) {
        PSTORE_ASSERT (f.valid ());
        f.get ();
    }
    log (priority::notice, "worker threads done: stopping quit thread");
    broker::notify_quit_thread ();
    quit.join ();
    log (priority::notice, "exiting");
    return broker::exit_code;
}